

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_t.cpp
# Opt level: O0

void __thiscall deci::dictionary_t::dictionary_t(dictionary_t *this)

{
  dictionary_t *this_local;
  
  value_t::value_t(&this->super_value_t);
  (this->super_value_t)._vptr_value_t = (_func_int **)&PTR_DoHashing_0011dcf0;
  memset(&this->storage,0,0x38);
  std::
  unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
  ::unordered_map(&this->storage);
  return;
}

Assistant:

dictionary_t::dictionary_t():value_t(), storage() {
    ;
  }